

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_server.cc
# Opt level: O0

char * bssl::tls13_server_handshake_state(SSL_HANDSHAKE *hs)

{
  tls13_server_hs_state_t state;
  SSL_HANDSHAKE *hs_local;
  
  switch(hs->tls13_state) {
  case 0:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_2c8a3d;
    break;
  case 1:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_2c8a61;
    break;
  case 2:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_2c8a78;
    break;
  case 3:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_2c8a8f;
    break;
  case 4:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_2c8a9a;
    break;
  case 5:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_2c8aa5;
    break;
  case 6:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_2c8ad3;
    break;
  case 7:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_2c8abc;
    break;
  case 8:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_2c8ade;
    break;
  case 9:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_2c8af5;
    break;
  case 10:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_2c8b00;
    break;
  case 0xb:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_2c8b17;
    break;
  case 0xc:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_2c8b2e;
    break;
  case 0xd:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_2c8b39;
    break;
  case 0xe:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_2c8b50;
    break;
  case 0xf:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_2c8b5b;
    break;
  case 0x10:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_2c8b66;
    break;
  default:
    hs_local = (SSL_HANDSHAKE *)anon_var_dwarf_2c8b7d;
  }
  return (char *)hs_local;
}

Assistant:

const char *tls13_server_handshake_state(SSL_HANDSHAKE *hs) {
  enum tls13_server_hs_state_t state =
      static_cast<enum tls13_server_hs_state_t>(hs->tls13_state);
  switch (state) {
    case state13_select_parameters:
      return "TLS 1.3 server select_parameters";
    case state13_select_session:
      return "TLS 1.3 server select_session";
    case state13_send_hello_retry_request:
      return "TLS 1.3 server send_hello_retry_request";
    case state13_read_second_client_hello:
      return "TLS 1.3 server read_second_client_hello";
    case state13_send_server_hello:
      return "TLS 1.3 server send_server_hello";
    case state13_send_server_certificate_verify:
      return "TLS 1.3 server send_server_certificate_verify";
    case state13_send_half_rtt_ticket:
      return "TLS 1.3 server send_half_rtt_ticket";
    case state13_send_server_finished:
      return "TLS 1.3 server send_server_finished";
    case state13_read_second_client_flight:
      return "TLS 1.3 server read_second_client_flight";
    case state13_process_end_of_early_data:
      return "TLS 1.3 server process_end_of_early_data";
    case state13_read_client_encrypted_extensions:
      return "TLS 1.3 server read_client_encrypted_extensions";
    case state13_read_client_certificate:
      return "TLS 1.3 server read_client_certificate";
    case state13_read_client_certificate_verify:
      return "TLS 1.3 server read_client_certificate_verify";
    case state13_read_channel_id:
      return "TLS 1.3 server read_channel_id";
    case state13_read_client_finished:
      return "TLS 1.3 server read_client_finished";
    case state13_send_new_session_ticket:
      return "TLS 1.3 server send_new_session_ticket";
    case state13_done:
      return "TLS 1.3 server done";
  }

  return "TLS 1.3 server unknown";
}